

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svg2png.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  pointer pDVar2;
  ostream *poVar3;
  undefined1 local_90 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> basename;
  size_type lastSlashIndex;
  Bitmap bitmap;
  unique_ptr<lunasvg::Document,_std::default_delete<lunasvg::Document>_> document;
  uint32_t local_44;
  uint32_t local_40;
  uint32_t bgColor;
  uint32_t height;
  uint32_t width;
  string filename;
  char **argv_local;
  int argc_local;
  
  filename.field_2._8_8_ = argv;
  std::__cxx11::string::string((string *)&height);
  bgColor = 0;
  local_40 = 0;
  local_44 = 0;
  bVar1 = setup(argc,(char **)filename.field_2._8_8_,(string *)&height,&bgColor,&local_40,&local_44)
  ;
  if (bVar1) {
    lunasvg::Document::loadFromFile((Document *)&bitmap,(string *)&height);
    bVar1 = std::operator==((unique_ptr<lunasvg::Document,_std::default_delete<lunasvg::Document>_>
                             *)&bitmap,(nullptr_t)0x0);
    if (bVar1) {
      argv_local._4_4_ = help();
    }
    else {
      pDVar2 = std::unique_ptr<lunasvg::Document,_std::default_delete<lunasvg::Document>_>::
               operator->((unique_ptr<lunasvg::Document,_std::default_delete<lunasvg::Document>_> *)
                          &bitmap);
      lunasvg::Document::renderToBitmap((Document *)&lastSlashIndex,(int)pDVar2,bgColor,local_40);
      bVar1 = lunasvg::Bitmap::isNull((Bitmap *)&lastSlashIndex);
      if (bVar1) {
        argv_local._4_4_ = help();
      }
      else {
        basename.field_2._8_8_ = std::__cxx11::string::find_last_of((char *)&height,0x18c0aa);
        if (basename.field_2._8_8_ == -1) {
          std::__cxx11::string::string((string *)local_90,(string *)&height);
        }
        else {
          std::__cxx11::string::substr((ulong)local_90,(ulong)&height);
        }
        std::__cxx11::string::append(local_90);
        lunasvg::Bitmap::writeToPng((Bitmap *)&lastSlashIndex,(string *)local_90);
        poVar3 = std::operator<<((ostream *)&std::cout,"Generated PNG file: ");
        poVar3 = std::operator<<(poVar3,(string *)local_90);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        argv_local._4_4_ = 0;
        std::__cxx11::string::~string((string *)local_90);
      }
      lunasvg::Bitmap::~Bitmap((Bitmap *)&lastSlashIndex);
    }
    std::unique_ptr<lunasvg::Document,_std::default_delete<lunasvg::Document>_>::~unique_ptr
              ((unique_ptr<lunasvg::Document,_std::default_delete<lunasvg::Document>_> *)&bitmap);
  }
  else {
    argv_local._4_4_ = help();
  }
  std::__cxx11::string::~string((string *)&height);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[])
{
    std::string filename;
    std::uint32_t width = 0, height = 0;
    std::uint32_t bgColor = 0x00000000;
    if(!setup(argc, argv, filename, width, height, bgColor)) {
        return help();
    }

    auto document = Document::loadFromFile(filename);
    if(document == nullptr) {
        return help();
    }

    auto bitmap = document->renderToBitmap(width, height, bgColor);
    if(bitmap.isNull()) {
        return help();
    }

    auto lastSlashIndex = filename.find_last_of("/\\");
    auto basename = lastSlashIndex == std::string::npos ? filename : filename.substr(lastSlashIndex + 1);
    basename.append(".png");

    bitmap.writeToPng(basename);
    std::cout << "Generated PNG file: " << basename << std::endl;
    return 0;
}